

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSharedPtr.hpp
# Opt level: O0

void __thiscall
de::SharedPtr<tcu::TextureCube>::SharedPtr(SharedPtr<tcu::TextureCube> *this,TextureCube *ptr)

{
  TextureCube *pTVar1;
  SharedPtrState<tcu::TextureCube,_de::DefaultDeleter<tcu::TextureCube>_> *pSVar2;
  DefaultDeleter<tcu::TextureCube> local_25 [13];
  TextureCube *local_18;
  TextureCube *ptr_local;
  SharedPtr<tcu::TextureCube> *this_local;
  
  this->m_ptr = (TextureCube *)0x0;
  this->m_state = (SharedPtrStateBase *)0x0;
  this->m_ptr = ptr;
  local_18 = ptr;
  ptr_local = (TextureCube *)this;
  pSVar2 = (SharedPtrState<tcu::TextureCube,_de::DefaultDeleter<tcu::TextureCube>_> *)
           operator_new(0x20);
  pTVar1 = local_18;
  DefaultDeleter<tcu::TextureCube>::DefaultDeleter(local_25);
  SharedPtrState<tcu::TextureCube,_de::DefaultDeleter<tcu::TextureCube>_>::SharedPtrState
            (pSVar2,pTVar1);
  this->m_state = (SharedPtrStateBase *)pSVar2;
  this->m_state->strongRefCount = 1;
  this->m_state->weakRefCount = 1;
  return;
}

Assistant:

inline SharedPtr<T>::SharedPtr (T* ptr)
	: m_ptr		(DE_NULL)
	, m_state	(DE_NULL)
{
	try
	{
		m_ptr	= ptr;
		m_state	= new SharedPtrState<T, DefaultDeleter<T> >(ptr, DefaultDeleter<T>());
		m_state->strongRefCount	= 1;
		m_state->weakRefCount	= 1;
	}
	catch (...)
	{
		// \note ptr is not released.
		delete m_state;
		throw;
	}
}